

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
spvtools::val::Function::CheckLimitations
          (Function *this,ValidationState_t *_,Function *entry_point,string *reason)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_228 [36];
  int local_204;
  undefined1 local_200 [8];
  string message;
  function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  *is_compatible;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  *__range2;
  stringstream ss_reason;
  ostream aoStack_1b0 [383];
  byte local_31;
  string *psStack_30;
  bool return_value;
  string *reason_local;
  Function *entry_point_local;
  ValidationState_t *__local;
  Function *this_local;
  
  local_31 = 1;
  psStack_30 = reason;
  reason_local = (string *)entry_point;
  entry_point_local = (Function *)_;
  __local = (ValidationState_t *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2 = std::__cxx11::
           list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
           ::begin(&this->limitations_);
  is_compatible =
       (function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
        *)std::__cxx11::
          list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
          ::end(&this->limitations_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&is_compatible), bVar1) {
    message.field_2._8_8_ =
         std::
         _List_const_iterator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>
         ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_200);
    bVar1 = std::
            function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
            ::operator()((function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)message.field_2._8_8_,(ValidationState_t *)entry_point_local,
                         (Function *)reason_local,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200);
    if (bVar1) {
LAB_0024d53d:
      local_204 = 0;
    }
    else {
      if (psStack_30 != (string *)0x0) {
        local_31 = 0;
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          poVar3 = std::operator<<(aoStack_1b0,(string *)local_200);
          std::operator<<(poVar3,"\n");
        }
        goto LAB_0024d53d;
      }
      this_local._7_1_ = 0;
      local_204 = 1;
    }
    std::__cxx11::string::~string((string *)local_200);
    if (local_204 != 0) goto LAB_0024d5c0;
    std::
    _List_const_iterator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>
    ::operator++(&__end2);
  }
  if (((local_31 & 1) == 0) && (psStack_30 != (string *)0x0)) {
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)psStack_30,local_228);
    std::__cxx11::string::~string(local_228);
  }
  this_local._7_1_ = local_31 & 1;
  local_204 = 1;
LAB_0024d5c0:
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Function::CheckLimitations(const ValidationState_t& _,
                                const Function* entry_point,
                                std::string* reason) const {
  bool return_value = true;
  std::stringstream ss_reason;

  for (const auto& is_compatible : limitations_) {
    std::string message;
    if (!is_compatible(_, entry_point, &message)) {
      if (!reason) return false;
      return_value = false;
      if (!message.empty()) {
        ss_reason << message << "\n";
      }
    }
  }

  if (!return_value && reason) {
    *reason = ss_reason.str();
  }

  return return_value;
}